

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

mcu8str * mctools_real_path(mcu8str *rawpath)

{
  char *pcVar1;
  mcu8str *in_RDI;
  mcu8str output;
  mcu8str native;
  char buf [4096];
  mcu8str path;
  mcu8str *path_00;
  mcu8str *in_stack_ffffffffffffefa8;
  mcu8str *in_stack_ffffffffffffefb0;
  undefined8 local_1048;
  char *local_1040;
  int local_18;
  
  path_00 = in_RDI;
  mctools_impl_view_no_winnamespace(in_RDI);
  if (local_18 == 0) {
    mcu8str_create_empty();
  }
  else {
    mcu8str_create_from_staticbuffer
              ((char *)in_stack_ffffffffffffefb0,(mcu8str_size_t)in_stack_ffffffffffffefa8);
    mcu8str_assign(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
    mctools_pathseps_platform(path_00);
    mcu8str_create((mcu8str_size_t)in_stack_ffffffffffffefb0);
    pcVar1 = realpath(local_1040,(char *)in_stack_ffffffffffffefa8);
    if (pcVar1 == (char *)0x0) {
      mcu8str_dealloc(path_00);
      mcu8str_dealloc(path_00);
      mcu8str_create_empty();
    }
    else {
      mcu8str_dealloc(path_00);
      mcu8str_update_size(path_00);
      mctools_pathseps_platform(path_00);
      in_RDI->c_str = (char *)in_stack_ffffffffffffefa8;
      *(mcu8str **)&in_RDI->size = in_stack_ffffffffffffefb0;
      *(undefined8 *)&in_RDI->owns_memory = local_1048;
    }
  }
  return path_00;
}

Assistant:

mcu8str mctools_real_path( const mcu8str* rawpath )
  {
    //NB: Might return empty in case of errors.
    mcu8str path = mctools_impl_view_no_winnamespace(rawpath);
    if ( path.size == 0 )
      return mcu8str_create_empty();

#ifdef MC_IS_WINDOWS
    //To resolve symlinks we must open a file handle with CreateFileW. If it
    //fails, we revert back to at least returning an absolute path.
    mcwinstr wpath = mc_path2wpath( &path );
    DWORD share = FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE;
    DWORD access = FILE_READ_ATTRIBUTES;
    DWORD flags = FILE_FLAG_BACKUP_SEMANTICS;
    HANDLE fh1 = CreateFileW( wpath.c_str, access, share, NULL,
                              OPEN_EXISTING, flags, NULL );
    if ( fh1 == INVALID_HANDLE_VALUE ) {
      //Failed to open. This can happen for a variety of reasons. As a fallback
      //option, we return the full path (which won't resolve symlinks):
      mcu8str output = mc_winstr_expand_to_fullpath_u8str( &wpath );
      mc_winstr_dealloc( &wpath );
      return output;
    }

    //We have an open handle fh1, use it to find the resolved path:
    mcwinstr resolvedpath = mc_winstr_create(4096);
    DWORD len = GetFinalPathNameByHandleW( fh1, resolvedpath.c_str,
                                           (DWORD)resolvedpath.buflen, 0 );
    if ( (mcu8str_size_t)len >= resolvedpath.buflen ) {
      //Too short buffer, try again:
      mc_winstr_dealloc(&resolvedpath);
      resolvedpath = mc_winstr_create(len);
      len = GetFinalPathNameByHandleW( fh1, resolvedpath.c_str,
                                       (DWORD)resolvedpath.buflen, 0 );
    }
    //Close the open file handle:
    CloseHandle( fh1 );
    if ( len == 0 || (mcu8str_size_t)len >= resolvedpath.buflen ) {
      //Failure, fall-back to unresolved absolute path:
      mc_winstr_dealloc(&resolvedpath);
      mcu8str output = mc_winstr_expand_to_fullpath_u8str( &wpath );
      mc_winstr_dealloc( &wpath );
      return output;
    }
    mc_winstr_dealloc( &wpath );
    resolvedpath.c_str[len] = 0;
    resolvedpath.size = len;
    //All ok, get rid of any 8.3-form path names and return:
    mcwinstr woutput = mc_impl_expand_wpath_to_longpathname( &resolvedpath );
    mc_winstr_dealloc(&resolvedpath);
    mcu8str output = mc_winstr_to_u8str( &woutput );
    mc_winstr_dealloc( &woutput );
    if ( mctools_impl_has_winnamespace( &output ) ) {
      mcu8str tmp = mctools_impl_view_no_winnamespace( &output );
      mcu8str_ensure_dynamic_buffer(&tmp);
      mcu8str_swap( &tmp, &output );
      mcu8str_dealloc(&tmp);
    }
#else
    char buf[4096];
    mcu8str native = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
    mcu8str_assign( &native, &path );
    mctools_pathseps_platform( &native );
    mcu8str output = mcu8str_create( PATH_MAX );
    if ( !realpath( native.c_str, output.c_str ) ) {
      //failure
      mcu8str_dealloc(&output);
      mcu8str_dealloc(&native);
      return mcu8str_create_empty();
    }
    mcu8str_dealloc(&native);
    mcu8str_update_size(&output);
#endif
    mctools_pathseps_platform(&output);
    return output;
  }